

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall absl::time_internal::cctz::TimeZoneInfo::ExtendTransitions(TimeZoneInfo *this)

{
  long lVar1;
  civil_time<absl::time_internal::cctz::detail::second_tag> lhs;
  value_type *__x;
  bool bVar2;
  weekday wd;
  reference pvVar3;
  size_type sVar4;
  year_t yVar5;
  int_fast64_t iVar6;
  int_fast64_t iVar7;
  bool local_211;
  value_type *local_210;
  Transition *tb;
  Transition *ta;
  int_fast64_t std_trans_off;
  int_fast64_t dst_trans_off;
  year_t limit;
  Transition std;
  Transition dst;
  undefined1 auStack_128 [4];
  int jan1_weekday;
  int_least64_t local_118;
  int_least64_t iStack_110;
  diff_t local_108;
  int_fast64_t jan1_time;
  civil_second jan1;
  undefined1 local_e8 [7];
  bool leap_year;
  reference local_c8;
  TransitionType *last_tt;
  int_fast64_t last_time;
  Transition *last;
  undefined4 local_a8;
  uint_least8_t dst_ti;
  uint_least8_t std_ti;
  undefined1 local_98 [8];
  PosixTimeZone posix;
  TimeZoneInfo *this_local;
  
  this->extended_ = false;
  posix.dst_end.time.offset = (int_fast32_t)this;
  bVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f1e1d);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    PosixTimeZone::PosixTimeZone((PosixTimeZone *)local_98);
    bVar2 = ParsePosixSpec(&this->future_spec_,(PosixTimeZone *)local_98);
    if (bVar2) {
      bVar2 = GetTransitionType(this,posix.std_abbr.field_2._8_8_,false,(string *)local_98,
                                (uint_least8_t *)((long)&last + 7));
      if (bVar2) {
        bVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f1ef7)
        ;
        if (bVar2) {
          pvVar3 = ::std::
                   vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                   ::back(&this->transitions_);
          this_local._7_1_ = EquivTransitions(this,pvVar3->type_index,last._7_1_);
        }
        else {
          bVar2 = GetTransitionType(this,posix.dst_abbr.field_2._8_8_,true,
                                    (string *)&posix.std_offset,(uint_least8_t *)((long)&last + 6));
          if (bVar2) {
            sVar4 = ::std::
                    vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                    ::size(&this->transitions_);
            ::std::
            vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
            ::reserve(&this->transitions_,sVar4 + 0x322);
            this->extended_ = true;
            last_time = (int_fast64_t)
                        ::std::
                        vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                        ::back(&this->transitions_);
            last_tt = (TransitionType *)((reference)last_time)->unix_time;
            local_c8 = ::std::
                       vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                       ::operator[](&this->transition_types_,
                                    (ulong)((reference)last_time)->type_index);
            LocalTime((absolute_lookup *)local_e8,this,(int_fast64_t)last_tt,local_c8);
            yVar5 = detail::civil_time<absl::time_internal::cctz::detail::second_tag>::year
                              ((civil_time<absl::time_internal::cctz::detail::second_tag> *)local_e8
                              );
            this->last_year_ = yVar5;
            jan1.f_._15_1_ = anon_unknown_0::IsLeap(this->last_year_);
            detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
                      ((civil_time<absl::time_internal::cctz::detail::second_tag> *)&jan1_time,
                       this->last_year_,1,1,0,0,0);
            local_118 = jan1_time;
            iStack_110 = jan1.f_.y;
            detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
                      ((civil_time<absl::time_internal::cctz::detail::second_tag> *)auStack_128);
            lhs.f_.m = (undefined1)iStack_110;
            lhs.f_.d = iStack_110._1_1_;
            lhs.f_.hh = iStack_110._2_1_;
            lhs.f_.mm = iStack_110._3_1_;
            lhs.f_.ss = iStack_110._4_1_;
            lhs.f_._13_3_ = iStack_110._5_3_;
            lhs.f_.y = local_118;
            local_108 = detail::operator-(lhs,(civil_time<absl::time_internal::cctz::detail::second_tag>
                                               )_auStack_128);
            wd = detail::get_weekday((civil_time<absl::time_internal::cctz::detail::second_tag> *)
                                     &jan1_time);
            dst.prev_civil_sec.f_._12_4_ = anon_unknown_0::ToPosixWeekday(wd);
            std.prev_civil_sec.f_.m = '\0';
            std.prev_civil_sec.f_.d = '\0';
            std.prev_civil_sec.f_.hh = '\0';
            std.prev_civil_sec.f_.mm = '\0';
            std.prev_civil_sec.f_.ss = '\0';
            std.prev_civil_sec.f_._13_3_ = 0;
            dst.unix_time._0_1_ = last._6_1_;
            detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
                      ((civil_time<absl::time_internal::cctz::detail::second_tag> *)&dst.type_index)
            ;
            detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
                      ((civil_time<absl::time_internal::cctz::detail::second_tag> *)
                       &dst.civil_sec.f_.m);
            limit = 0;
            std.unix_time._0_1_ = last._7_1_;
            detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
                      ((civil_time<absl::time_internal::cctz::detail::second_tag> *)&std.type_index)
            ;
            detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
                      ((civil_time<absl::time_internal::cctz::detail::second_tag> *)
                       &std.civil_sec.f_.m);
            lVar1 = this->last_year_;
            while( true ) {
              iVar6 = anon_unknown_0::TransOffset
                                ((bool)(jan1.f_._15_1_ & 1),dst.prev_civil_sec.f_._12_4_,
                                 (PosixTransition *)&posix.dst_offset);
              iVar7 = anon_unknown_0::TransOffset
                                ((bool)(jan1.f_._15_1_ & 1),dst.prev_civil_sec.f_._12_4_,
                                 (PosixTransition *)&posix.dst_start.time);
              std.prev_civil_sec.f_._8_8_ = (local_108 + iVar6) - posix.std_abbr.field_2._8_8_;
              limit = (local_108 + iVar7) - posix.dst_abbr.field_2._8_8_;
              if ((long)std.prev_civil_sec.f_._8_8_ < limit) {
                __x = (value_type *)&std.prev_civil_sec.f_.m;
                local_210 = (value_type *)&limit;
              }
              else {
                __x = (value_type *)&limit;
                local_210 = (value_type *)&std.prev_civil_sec.f_.m;
              }
              if ((long)last_tt < local_210->unix_time) {
                if ((long)last_tt < __x->unix_time) {
                  ::std::
                  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                  ::push_back(&this->transitions_,__x);
                }
                ::std::
                vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                ::push_back(&this->transitions_,local_210);
              }
              if (this->last_year_ == lVar1 + 400) break;
              local_108 = *(int *)((long)&(anonymous_namespace)::kSecsPerYear +
                                  (ulong)(jan1.f_._15_1_ & 1) * 4) + local_108;
              dst.prev_civil_sec.f_._12_4_ =
                   (dst.prev_civil_sec.f_._12_4_ +
                   *(int *)((long)&(anonymous_namespace)::kDaysPerYear +
                           (ulong)(jan1.f_._15_1_ & 1) * 4)) % 7;
              local_211 = false;
              if ((jan1.f_._15_1_ & 1) == 0) {
                local_211 = anon_unknown_0::IsLeap(this->last_year_ + 1);
              }
              jan1.f_._15_1_ = local_211;
              this->last_year_ = this->last_year_ + 1;
            }
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    local_a8 = 1;
    PosixTimeZone::~PosixTimeZone((PosixTimeZone *)local_98);
  }
  return this_local._7_1_;
}

Assistant:

bool TimeZoneInfo::ExtendTransitions() {
  extended_ = false;
  if (future_spec_.empty()) return true;  // last transition prevails

  PosixTimeZone posix;
  if (!ParsePosixSpec(future_spec_, &posix)) return false;

  // Find transition type for the future std specification.
  std::uint_least8_t std_ti;
  if (!GetTransitionType(posix.std_offset, false, posix.std_abbr, &std_ti))
    return false;

  if (posix.dst_abbr.empty()) {  // std only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, std_ti);
  }

  // Find transition type for the future dst specification.
  std::uint_least8_t dst_ti;
  if (!GetTransitionType(posix.dst_offset, true, posix.dst_abbr, &dst_ti))
    return false;

  // Extend the transitions for an additional 400 years using the
  // future specification. Years beyond those can be handled by
  // mapping back to a cycle-equivalent year within that range.
  // We may need two additional transitions for the current year.
  transitions_.reserve(transitions_.size() + 400 * 2 + 2);
  extended_ = true;

  const Transition& last(transitions_.back());
  const std::int_fast64_t last_time = last.unix_time;
  const TransitionType& last_tt(transition_types_[last.type_index]);
  last_year_ = LocalTime(last_time, last_tt).cs.year();
  bool leap_year = IsLeap(last_year_);
  const civil_second jan1(last_year_);
  std::int_fast64_t jan1_time = jan1 - civil_second();
  int jan1_weekday = ToPosixWeekday(get_weekday(jan1));

  Transition dst = {0, dst_ti, civil_second(), civil_second()};
  Transition std = {0, std_ti, civil_second(), civil_second()};
  for (const year_t limit = last_year_ + 400;; ++last_year_) {
    auto dst_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_start);
    auto std_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_end);
    dst.unix_time = jan1_time + dst_trans_off - posix.std_offset;
    std.unix_time = jan1_time + std_trans_off - posix.dst_offset;
    const auto* ta = dst.unix_time < std.unix_time ? &dst : &std;
    const auto* tb = dst.unix_time < std.unix_time ? &std : &dst;
    if (last_time < tb->unix_time) {
      if (last_time < ta->unix_time) transitions_.push_back(*ta);
      transitions_.push_back(*tb);
    }
    if (last_year_ == limit) break;
    jan1_time += kSecsPerYear[leap_year];
    jan1_weekday = (jan1_weekday + kDaysPerYear[leap_year]) % 7;
    leap_year = !leap_year && IsLeap(last_year_ + 1);
  }

  return true;
}